

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
::Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
            *)operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_00f6a8a0;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }